

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_op_t * MIR_new_ldouble_op(MIR_op_t *__return_storage_ptr__,MIR_context_t ctx,longdouble ld)

{
  __return_storage_ptr__->field_0x8 = 7;
  __return_storage_ptr__->data = (void *)0x0;
  (__return_storage_ptr__->u).ld = ld;
  return __return_storage_ptr__;
}

Assistant:

MIR_op_t MIR_new_ldouble_op (MIR_context_t ctx MIR_UNUSED, long double ld) {
  MIR_op_t op;

#if defined(_WIN32) || __SIZEOF_LONG_DOUBLE__ == 8
  return MIR_new_double_op (ctx, ld);
#endif
  mir_assert (sizeof (long double) == 16); /* machine-defined 80- or 128-bit FP  */
  init_op (&op, MIR_OP_LDOUBLE);
  op.u.ld = ld;
  return op;
}